

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

bool __thiscall cmRST::ProcessFile(cmRST *this,string *fname,bool isModule)

{
  uint uVar1;
  string sStack_248;
  ifstream fin;
  uint auStack_208 [122];
  
  std::ifstream::ifstream(&fin,(fname->_M_dataplus)._M_p,_S_in);
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(_fin + -0x18));
  if ((uVar1 & 5) == 0) {
    cmsys::SystemTools::GetFilenamePath(&sStack_248,fname);
    std::__cxx11::string::operator=((string *)&this->DocDir,(string *)&sStack_248);
    std::__cxx11::string::~string((string *)&sStack_248);
    if (isModule) {
      ProcessModule(this,(istream *)&fin);
    }
    else {
      ProcessRST(this,(istream *)&fin);
    }
    this->OutputLinePending = true;
  }
  std::ifstream::~ifstream(&fin);
  return (uVar1 & 5) == 0;
}

Assistant:

bool cmRST::ProcessFile(std::string const& fname, bool isModule)
{
  cmsys::ifstream fin(fname.c_str());
  if (fin) {
    this->DocDir = cmSystemTools::GetFilenamePath(fname);
    if (isModule) {
      this->ProcessModule(fin);
    } else {
      this->ProcessRST(fin);
    }
    this->OutputLinePending = true;
    return true;
  }
  return false;
}